

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_text(char *text,int posX,int posY,int font_size,rf_color color)

{
  size_t sVar1;
  ulong uVar2;
  rf_vec2 position;
  
  sVar1 = strlen(text);
  if (((int)sVar1 != 0) && ((rf__ctx->field_0).default_font.texture.id != 0)) {
    position.x = (float)posX;
    position.y = (float)posY;
    uVar2 = 10;
    if (10 < font_size) {
      uVar2 = (ulong)(uint)font_size;
    }
    rf_draw_string_ex((rf__ctx->field_0).default_font,text,(int)sVar1,position,(float)(int)uVar2,
                      (float)(uint)(uVar2 * 0x66666667 >> 0x22),color);
  }
  return;
}

Assistant:

RF_API void rf_draw_text(const char* text, int posX, int posY, int font_size, rf_color color) { rf_draw_string(text, strlen(text), posX, posY, font_size, color); }